

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# headers.c
# Opt level: O0

CURLcode Curl_headers_cleanup(Curl_easy *data)

{
  void *pvVar1;
  Curl_header_store *hs;
  Curl_llist_node *n;
  Curl_llist_node *e;
  Curl_easy *data_local;
  
  n = Curl_llist_head(&(data->state).httphdrs);
  while (n != (Curl_llist_node *)0x0) {
    pvVar1 = Curl_node_elem(n);
    n = Curl_node_next(n);
    (*Curl_cfree)(pvVar1);
  }
  headers_reset(data);
  return CURLE_OK;
}

Assistant:

CURLcode Curl_headers_cleanup(struct Curl_easy *data)
{
  struct Curl_llist_node *e;
  struct Curl_llist_node *n;

  for(e = Curl_llist_head(&data->state.httphdrs); e; e = n) {
    struct Curl_header_store *hs = Curl_node_elem(e);
    n = Curl_node_next(e);
    free(hs);
  }
  headers_reset(data);
  return CURLE_OK;
}